

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::X3DImporter::FindNodeElement
          (X3DImporter *this,string *pID,EType pType,CX3DImporter_NodeElement **pElement)

{
  bool bVar1;
  CX3DImporter_NodeElement *pCStack_38;
  bool static_search;
  CX3DImporter_NodeElement *tnd;
  CX3DImporter_NodeElement **pElement_local;
  EType pType_local;
  string *pID_local;
  X3DImporter *this_local;
  
  pCStack_38 = this->NodeElement_Cur;
  bVar1 = false;
  do {
    if (pCStack_38 == (CX3DImporter_NodeElement *)0x0) {
LAB_00a738b2:
      if (bVar1) {
        this_local._7_1_ = FindNodeElement_FromNode(this,pCStack_38,pID,pType,pElement);
      }
      else {
        this_local._7_1_ = FindNodeElement_FromRoot(this,pID,pType,pElement);
      }
      return this_local._7_1_;
    }
    if ((pCStack_38->Type == ENET_Group) &&
       (((ulong)pCStack_38[1].Child.
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node.super__List_node_base._M_prev & 1) != 0)) {
      bVar1 = true;
      goto LAB_00a738b2;
    }
    pCStack_38 = pCStack_38->Parent;
  } while( true );
}

Assistant:

bool X3DImporter::FindNodeElement(const std::string& pID, const CX3DImporter_NodeElement::EType pType, CX3DImporter_NodeElement** pElement)
{
    CX3DImporter_NodeElement* tnd = NodeElement_Cur;// temporary pointer to node.
    bool static_search = false;// flag: true if searching in static node.

    // At first check if we have deal with static node. Go up through parent nodes and check flag.
    while(tnd != nullptr)
    {
		if(tnd->Type == CX3DImporter_NodeElement::ENET_Group)
		{
			if(((CX3DImporter_NodeElement_Group*)tnd)->Static)
			{
				static_search = true;// Flag found, stop walking up. Node with static flag will holded in tnd variable.
				break;
			}
		}

		tnd = tnd->Parent;// go up in graph.
    }// while(tnd != nullptr)

    // at now call appropriate search function.
    if ( static_search )
    {
        return FindNodeElement_FromNode( tnd, pID, pType, pElement );
    }
    else
    {
        return FindNodeElement_FromRoot( pID, pType, pElement );
    }
}